

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

__pid_t __thiscall
kj::Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::wait
          (Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *this,
          void *__stat_loc)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *node;
  ExceptionOr<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *result_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>_2
  in_RDX;
  undefined1 in_stack_00000008 [24];
  undefined1 local_1c8 [8];
  ExceptionOr<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> result;
  WaitScope *waitScope_local;
  Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *this_local;
  
  result.value.ptr.field_1 = in_RDX;
  kj::_::ExceptionOr<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::ExceptionOr
            ((ExceptionOr<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
             local_1c8);
  node = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>
                   ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)__stat_loc);
  kj::_::waitImpl(node,(ExceptionOrValue *)local_1c8,(WaitScope *)result.value.ptr.field_1,
                  (SourceLocation)in_stack_00000008);
  result_00 = mv<kj::_::ExceptionOr<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>>>
                        ((ExceptionOr<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>
                          *)local_1c8);
  kj::_::convertToReturn<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server&>>
            ((_ *)this,result_00);
  kj::_::ExceptionOr<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_>::~ExceptionOr
            ((ExceptionOr<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> *)
             local_1c8);
  return (__pid_t)this;
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope, SourceLocation location) {
  _::ExceptionOr<_::FixVoid<T>> result;
  _::waitImpl(kj::mv(node), result, waitScope, location);
  return convertToReturn(kj::mv(result));
}